

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O1

SweepState __thiscall
Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::Sweep
          (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this,
          RecyclerSweep *recyclerSweep,bool queuePendingSweep,bool allocable)

{
  code *pcVar1;
  bool bVar2;
  SweepState SVar3;
  undefined4 *puVar4;
  
  bVar2 = RecyclerSweep::IsBackground(recyclerSweep);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x1c0,"(!recyclerSweep.IsBackground())","!recyclerSweep.IsBackground()");
    if (!bVar2) goto LAB_0073c00b;
    *puVar4 = 0;
  }
  if (queuePendingSweep) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                       ,0x1c1,"(!queuePendingSweep)","!queuePendingSweep");
    if (!bVar2) {
LAB_0073c00b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SVar3 = SmallHeapBlockT<MediumAllocationBlockAttributes>::Sweep
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)this,recyclerSweep,false,
                     allocable,this->finalizeCount,
                     this->disposedObjectList != (FreeObject *)0x0 || this->pendingDisposeCount != 0
                    );
  return SVar3;
}

Assistant:

SweepState
SmallFinalizableHeapBlockT<TBlockAttributes>::Sweep(RecyclerSweep& recyclerSweep, bool queuePendingSweep, bool allocable)
{
    Assert(!recyclerSweep.IsBackground());
    Assert(!queuePendingSweep);

    // If there are finalizable objects in this heap block, they need to be swept
    // in-thread and not in the concurrent thread, so don't queue pending sweep

    return SmallNormalHeapBlockT<TBlockAttributes>::Sweep(recyclerSweep, false, allocable, this->finalizeCount, HasAnyDisposeObjects());
}